

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

void __thiscall Lib::DArray<int>::~DArray(DArray<int> *this)

{
  int *piVar1;
  ulong uVar2;
  
  piVar1 = this->_array;
  if (piVar1 != (int *)0x0) {
    uVar2 = this->_capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = piVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = piVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = piVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = piVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = piVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(piVar1,0x10);
      return;
    }
    *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = piVar1;
  }
  return;
}

Assistant:

inline ~DArray()
  {
    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
  }